

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

int Gia_ManSatAndCollect_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vObjsUsed,Vec_Int_t *vCiVars)

{
  int Entry;
  uint uVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  
  Entry = Vec_IntEntry(&p->vCopies,iObj);
  if (Entry < 0) {
    pGVar2 = Gia_ManObj(p,iObj);
    uVar1 = (uint)*(undefined8 *)pGVar2;
    bVar3 = (~uVar1 & 0x1fffffff) == 0;
    if ((uVar1 & 0x9fffffff) != 0x9fffffff && (bVar3 || (int)uVar1 < 0)) {
      __assert_fail("Gia_ObjIsCand(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                    ,0x3fb,
                    "int Gia_ManSatAndCollect_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    if (!bVar3 && (int)uVar1 >= 0) {
      Gia_ManSatAndCollect_rec(p,iObj - (uVar1 & 0x1fffffff),vObjsUsed,vCiVars);
      Gia_ManSatAndCollect_rec
                (p,iObj - (*(uint *)&pGVar2->field_0x4 & 0x1fffffff),vObjsUsed,vCiVars);
    }
    Entry = vObjsUsed->nSize;
    Vec_IntPush(vObjsUsed,iObj);
    Vec_IntWriteEntry(&p->vCopies,iObj,Entry);
    if ((vCiVars != (Vec_Int_t *)0x0) &&
       (((undefined1  [12])*pGVar2 & (undefined1  [12])0x9fffffff) == (undefined1  [12])0x9fffffff))
    {
      Vec_IntPush(vCiVars,Entry);
    }
  }
  return Entry;
}

Assistant:

int Gia_ManSatAndCollect_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vObjsUsed, Vec_Int_t * vCiVars )
{
    Gia_Obj_t * pObj; int iVar;
    if ( (iVar = Gia_ObjCopyArray(p, iObj)) >= 0 )
        return iVar;
    pObj = Gia_ManObj( p, iObj );
    assert( Gia_ObjIsCand(pObj) );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManSatAndCollect_rec( p, Gia_ObjFaninId0(pObj, iObj), vObjsUsed, vCiVars );
        Gia_ManSatAndCollect_rec( p, Gia_ObjFaninId1(pObj, iObj), vObjsUsed, vCiVars );
    }
    iVar = Vec_IntSize( vObjsUsed );
    Vec_IntPush( vObjsUsed, iObj );
    Gia_ObjSetCopyArray( p, iObj, iVar );
    if ( vCiVars && Gia_ObjIsCi(pObj) )
        Vec_IntPush( vCiVars, iVar );
    return iVar;
}